

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

string * __thiscall
duckdb::UpdateInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,UpdateInfo *this)

{
  UndoBufferEntry *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  size_type *psVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  idx_t index;
  string __str_2;
  string __str_1;
  string __str;
  UndoBufferReference next_pin;
  string local_160;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string local_d0;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  undefined1 local_70 [24];
  optional_ptr<duckdb::FileBuffer,_true> oStack_58;
  Val local_50 [2];
  
  LogicalType::ToString_abi_cxx11_(&local_d0,&this->segment->column_data->type);
  plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1355806);
  local_100 = &local_f0;
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_f0 = *plVar10;
    lStack_e8 = plVar8[3];
  }
  else {
    local_f0 = *plVar10;
    local_100 = (long *)*plVar8;
  }
  local_f8 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_100);
  local_120 = &local_110;
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_110 = *puVar11;
    lStack_108 = plVar8[3];
  }
  else {
    local_110 = *puVar11;
    local_120 = (ulong *)*plVar8;
  }
  local_118 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar3 = this->N;
  cVar7 = '\x01';
  if (9 < uVar3) {
    uVar14 = uVar3;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar14 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0060d594;
      }
      if (uVar14 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0060d594;
      }
      if (uVar14 < 10000) goto LAB_0060d594;
      bVar4 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar4);
    cVar7 = cVar7 + '\x01';
  }
LAB_0060d594:
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,local_88,uVar3);
  uVar15 = CONCAT44(uStack_84,local_88) + local_118;
  uVar12 = 0xf;
  if (local_120 != &local_110) {
    uVar12 = local_110;
  }
  if (uVar12 < uVar15) {
    uVar12 = 0xf;
    if (local_90 != local_80) {
      uVar12 = local_80[0];
    }
    if (uVar12 < uVar15) goto LAB_0060d615;
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_0060d615:
    puVar9 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_90);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar13 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_160.field_2._M_allocated_capacity = *psVar13;
    local_160.field_2._8_8_ = puVar9[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar13;
    local_160._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_160._M_string_length = puVar9[1];
  *puVar9 = psVar13;
  puVar9[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_160);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_130 = *puVar11;
    lStack_128 = plVar8[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *puVar11;
    local_140 = (ulong *)*plVar8;
  }
  local_138 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar15 = (this->version_number).super___atomic_base<unsigned_long>._M_i;
  cVar7 = '\x01';
  if (9 < uVar15) {
    uVar12 = uVar15;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar12 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0060d72e;
      }
      if (uVar12 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0060d72e;
      }
      if (uVar12 < 10000) goto LAB_0060d72e;
      bVar4 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar4);
    cVar7 = cVar7 + '\x01';
  }
LAB_0060d72e:
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct((ulong)&local_b0,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar15);
  uVar15 = CONCAT44(uStack_a4,local_a8) + local_138;
  uVar12 = 0xf;
  if (local_140 != &local_130) {
    uVar12 = local_130;
  }
  if (uVar12 < uVar15) {
    uVar12 = 0xf;
    if (local_b0 != local_a0) {
      uVar12 = local_a0[0];
    }
    if (uVar15 <= uVar12) {
      plVar8 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_b0,0,(char *)0x0,(ulong)local_140);
      goto LAB_0060d7c9;
    }
  }
  plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_b0);
LAB_0060d7c9:
  local_70._0_8_ = local_70 + 0x10;
  pUVar1 = (UndoBufferEntry *)(plVar8 + 2);
  if ((UndoBufferEntry *)*plVar8 == pUVar1) {
    local_70._16_8_ = pUVar1->buffer_manager;
    oStack_58.ptr = (FileBuffer *)plVar8[3];
  }
  else {
    local_70._16_8_ = pUVar1->buffer_manager;
    local_70._0_8_ = (UndoBufferEntry *)*plVar8;
  }
  local_70._8_8_ = plVar8[1];
  *plVar8 = (long)pUVar1;
  plVar8[1] = 0;
  *(undefined1 *)&pUVar1->buffer_manager = 0;
  plVar8 = (long *)::std::__cxx11::string::append(local_70);
  paVar2 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar13) {
    lVar5 = plVar8[3];
    paVar2->_M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((UndoBufferEntry *)local_70._0_8_ != (UndoBufferEntry *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  local_d8 = paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_e0 = __return_storage_ptr__;
  if (this->N != 0) {
    index = 0;
    do {
      local_100 = &local_f0;
      uVar3 = *(uint *)((long)&this[1].segment + index * 4);
      cVar7 = '\x01';
      if (9 < uVar3) {
        uVar14 = uVar3;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (uVar14 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_0060d9b3;
          }
          if (uVar14 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_0060d9b3;
          }
          if (uVar14 < 10000) goto LAB_0060d9b3;
          bVar4 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar4);
        cVar7 = cVar7 + '\x01';
      }
LAB_0060d9b3:
      ::std::__cxx11::string::_M_construct((ulong)&local_100,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100,(uint)local_f8,uVar3);
      puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_100);
      __return_storage_ptr__ = local_e0;
      local_120 = &local_110;
      puVar11 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar11) {
        local_110 = *puVar11;
        lStack_108 = puVar9[3];
      }
      else {
        local_110 = *puVar11;
        local_120 = (ulong *)*puVar9;
      }
      local_118 = puVar9[1];
      *puVar9 = puVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      GetValue((Value *)local_70,this,index);
      Value::ToString_abi_cxx11_(&local_d0,(Value *)local_70);
      uVar15 = 0xf;
      if (local_120 != &local_110) {
        uVar15 = local_110;
      }
      if (uVar15 < local_d0._M_string_length + local_118) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          uVar16 = local_d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_d0._M_string_length + local_118) goto LAB_0060daa6;
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_120);
      }
      else {
LAB_0060daa6:
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_120,(ulong)local_d0._M_dataplus._M_p);
      }
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_160.field_2._M_allocated_capacity = *psVar13;
        local_160.field_2._8_8_ = puVar9[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar13;
        local_160._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_160._M_string_length = puVar9[1];
      *puVar9 = psVar13;
      puVar9[1] = 0;
      *(undefined1 *)psVar13 = 0;
      puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_160);
      local_140 = &local_130;
      puVar11 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar11) {
        local_130 = *puVar11;
        lStack_128 = puVar9[3];
      }
      else {
        local_130 = *puVar11;
        local_140 = (ulong *)*puVar9;
      }
      local_138 = puVar9[1];
      *puVar9 = puVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Value::~Value((Value *)local_70);
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100);
      }
      index = index + 1;
    } while (index < this->N);
  }
  if ((this->next).entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin((UndoBufferReference *)local_70,&this->next);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&oStack_58);
    ToString_abi_cxx11_(&local_160,(UpdateInfo *)((oStack_58.ptr)->buffer + local_50[0].bigint));
    plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x1355831);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar11) {
      local_130 = *puVar11;
      lStack_128 = plVar8[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *puVar11;
      local_140 = (ulong *)*plVar8;
    }
    local_138 = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    BufferHandle::~BufferHandle((BufferHandle *)(local_70 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

string UpdateInfo::ToString() {
	auto &type = segment->column_data.type;
	string result = "Update Info [" + type.ToString() + ", Count: " + to_string(N) +
	                ", Transaction Id: " + to_string(version_number) + "]\n";
	auto tuples = GetTuples();
	for (idx_t i = 0; i < N; i++) {
		result += to_string(tuples[i]) + ": " + GetValue(i).ToString() + "\n";
	}
	if (HasNext()) {
		auto next_pin = next.Pin();
		result += "\nChild Segment: " + Get(next_pin).ToString();
	}
	return result;
}